

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O3

int CfdFreeStringBuffer(char *address)

{
  cfd::Initialize();
  if (address != (char *)0x0) {
    free(address);
  }
  return 0;
}

Assistant:

int CfdFreeStringBuffer(char* address) {
  try {
    cfd::Initialize();
    if (address != nullptr) ::free(address);
    return kCfdSuccess;
  } catch (...) {
    return kCfdUnknownError;
  }
}